

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void filemgr_set_cancel_compaction(filemgr *file,bool cancel)

{
  pthread_spin_lock(&file->lock);
  file->fflags = cancel << 6 | file->fflags & 0xbf;
  pthread_spin_unlock(&file->lock);
  return;
}

Assistant:

void filemgr_set_cancel_compaction(struct filemgr *file, bool cancel)
{
    spin_lock(&file->lock);
    if (cancel) {
        file->fflags |= FILEMGR_CANCEL_COMPACTION;
    } else {
        file->fflags &= ~FILEMGR_CANCEL_COMPACTION;
    }
    spin_unlock(&file->lock);
}